

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O1

wchar_t ui_entry_search_categories(ui_entry *entry,char *name,int *ind)

{
  bool bVar1;
  int iVar2;
  wchar_t unaff_EBP;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  
  wVar3 = entry->n_category;
  wVar5 = L'\0';
  do {
    if (wVar5 == wVar3) {
      *ind = wVar5;
      unaff_EBP = L'\0';
LAB_001e24e0:
      bVar1 = false;
    }
    else {
      wVar4 = (wVar3 + wVar5) / 2;
      iVar2 = strcmp(entry->categories[wVar4].name,name);
      if (iVar2 == 0) {
        *ind = wVar4;
        unaff_EBP = L'\x01';
        goto LAB_001e24e0;
      }
      if (iVar2 < 0) {
        wVar5 = wVar4 + L'\x01';
        wVar4 = wVar3;
      }
      bVar1 = true;
      wVar3 = wVar4;
    }
    if (!bVar1) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

static int ui_entry_search_categories(const struct ui_entry *entry,
	const char *name, int *ind)
{
	/* They're sorted by name so use a binary search. */
	int ilow = 0, ihigh = entry->n_category;

	while (1) {
		int imid, cmp;

		if (ilow == ihigh) {
			*ind = ilow;
			return 0;
		}
		imid = (ilow + ihigh) / 2;
		cmp = strcmp(entry->categories[imid].name, name);
		if (cmp == 0) {
			*ind = imid;
			return 1;
		}
		if (cmp < 0) {
			ilow = imid + 1;
		} else {
			ihigh = imid;
		}
	}
}